

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

string * __thiscall
re2::DFA::DumpState_abi_cxx11_(string *__return_storage_ptr__,DFA *this,State *state)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  if (this == (DFA *)0x2) {
    pcVar3 = "*";
    pcVar2 = "";
  }
  else if (this == (DFA *)0x1) {
    pcVar3 = "X";
    pcVar2 = "";
  }
  else {
    if (this != (DFA *)0x0) {
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      StringPrintf_abi_cxx11_(&local_58,"(%p)",this);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      if (0 < (int)this->kind_) {
        lVar4 = 0;
        pcVar2 = anon_var_dwarf_3d3289 + 0x11;
        do {
          iVar1 = this->prog_->inst_count_[lVar4 + -9];
          if ((iVar1 == -2) || (iVar1 == -1)) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            pcVar2 = anon_var_dwarf_3d3289 + 0x11;
          }
          else {
            StringPrintf_abi_cxx11_
                      (&local_58,"%s%d",pcVar2,(ulong)(uint)this->prog_->inst_count_[lVar4 + -9]);
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p);
            }
            pcVar2 = ",";
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < (int)this->kind_);
      }
      StringPrintf_abi_cxx11_(&local_58," flag=%#x",(ulong)*(uint *)&this->init_failed_);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p == &local_58.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_58._M_dataplus._M_p);
      return __return_storage_ptr__;
    }
    pcVar3 = "_";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string DFA::DumpState(State* state) {
  if (state == NULL)
    return "_";
  if (state == DeadState)
    return "X";
  if (state == FullMatchState)
    return "*";
  std::string s;
  const char* sep = "";
  s += StringPrintf("(%p)", state);
  for (int i = 0; i < state->ninst_; i++) {
    if (state->inst_[i] == Mark) {
      s += "|";
      sep = "";
    } else if (state->inst_[i] == MatchSep) {
      s += "||";
      sep = "";
    } else {
      s += StringPrintf("%s%d", sep, state->inst_[i]);
      sep = ",";
    }
  }
  s += StringPrintf(" flag=%#x", state->flag_);
  return s;
}